

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O2

qlonglong __thiscall QVariant::toLongLong(QVariant *this,bool *ok)

{
  longlong lVar1;
  
  lVar1 = qNumVariantToHelper<long_long>(&this->d,ok);
  return lVar1;
}

Assistant:

qlonglong QVariant::toLongLong(bool *ok) const
{
    return qNumVariantToHelper<qlonglong>(d, ok);
}